

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

void rgb_888_to_single_channel_8
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  long lVar3;
  int iVar4;
  
  if (0 < height) {
    puVar2 = (undefined1 *)((long)dst + (long)(dy * dst_pitch) + (long)dx);
    lVar3 = (long)src + (long)(sy * src_pitch) + (long)(sx * 3);
    iVar4 = 0;
    do {
      if (0 < width) {
        puVar1 = puVar2 + width;
        do {
          *puVar2 = *(undefined1 *)(lVar3 + 2);
          lVar3 = lVar3 + 3;
          puVar2 = puVar2 + 1;
        } while (puVar2 < puVar1);
      }
      puVar2 = puVar2 + (dst_pitch - width);
      lVar3 = lVar3 + (src_pitch + width * -3);
      iVar4 = iVar4 + 1;
    } while (iVar4 != height);
  }
  return;
}

Assistant:

static void rgb_888_to_single_channel_8(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint8_t *src_ptr = (const uint8_t *)((const char *)src + sy * src_pitch);
   uint8_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 1 - width * 3;
   int dst_gap = dst_pitch / 1 - width;
   src_ptr += sx * 3;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint8_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         #ifdef ALLEGRO_BIG_ENDIAN
         int src_pixel = src_ptr[2] | (src_ptr[1] << 8) | (src_ptr[0] << 16);
         #else
         int src_pixel = src_ptr[0] | (src_ptr[1] << 8) | (src_ptr[2] << 16);
         #endif
         *dst_ptr = ALLEGRO_CONVERT_RGB_888_TO_SINGLE_CHANNEL_8(src_pixel);
         src_ptr += 1 * 3;
         dst_ptr += 1;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}